

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O1

CTcPrsNode * __thiscall
CTPNObjPropBase::adjust_for_dyn(CTPNObjPropBase *this,tcpn_dyncomp_info *info)

{
  CTPNCodeBody *pCVar1;
  CTPNAnonFunc *pCVar2;
  CTcPrsNode *pCVar3;
  int iVar4;
  undefined4 extraout_var;
  
  pCVar1 = this->code_body_;
  if (pCVar1 != (CTPNCodeBody *)0x0) {
    (*(pCVar1->super_CTPNCodeBodyBase).super_CTPNStmTop.super_CTPNStm.super_CTPNStmBase.
      super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase[0x11])(pCVar1,info);
  }
  pCVar2 = this->inline_method_;
  if (pCVar2 != (CTPNAnonFunc *)0x0) {
    (*(pCVar2->super_CTPNAnonFuncBase).super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase
      [0x11])(pCVar2,info);
  }
  pCVar3 = this->expr_;
  if (pCVar3 != (CTcPrsNode *)0x0) {
    iVar4 = (*(pCVar3->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0x11])(pCVar3,info);
    this->expr_ = (CTcPrsNode *)CONCAT44(extraout_var,iVar4);
  }
  return (CTcPrsNode *)this;
}

Assistant:

CTcPrsNode *CTPNObjPropBase::adjust_for_dyn(const tcpn_dyncomp_info *info)
{
    /* adjust my various elements */
    if (code_body_ != 0)
        code_body_->adjust_for_dyn(info);
    if (inline_method_ != 0)
        inline_method_->adjust_for_dyn(info);
    if (expr_ != 0)
        expr_ = expr_->adjust_for_dyn(info);

    /* we did our adjustments in-place */
    return this;
}